

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void __thiscall
LinearNE<0,_1,_1>::LinearNE
          (LinearNE<0,_1,_1> *this,vec<int> *a,vec<IntVar_*> *_x,int _c,BoolView *_r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  IntView<0> *pIVar5;
  undefined4 in_ECX;
  vec<IntVar_*> *in_RDX;
  vec<int> *in_RSI;
  undefined8 *in_RDI;
  int i_2;
  uint i_1;
  uint i;
  vec<IntView<0>_> w;
  BoolView *in_stack_ffffffffffffff38;
  IntVar *v;
  Propagator *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  IntVar *in_stack_ffffffffffffff50;
  Propagator *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int local_7c;
  IntView<0> local_78;
  uint local_64;
  IntView<0> local_60;
  uint local_4c;
  vec<IntView<0>_> local_48 [2];
  undefined4 local_1c;
  vec<IntVar_*> *local_18;
  vec<int> *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Propagator::Propagator(in_stack_ffffffffffffff40);
  *in_RDI = &PTR__LinearNE_0031e428;
  uVar1 = vec<IntVar_*>::size(local_18);
  *(uint *)(in_RDI + 3) = uVar1;
  *(undefined4 *)(in_RDI + 6) = local_1c;
  BoolView::BoolView((BoolView *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Tint::Tint((Tint *)(in_RDI + 9),*(int *)(in_RDI + 3));
  Tint64_t::Tint64_t((Tint64_t *)(in_RDI + 10),(long)-*(int *)(in_RDI + 6));
  vec<IntView<0>_>::vec(local_48);
  local_4c = 0;
  while( true ) {
    uVar1 = local_4c;
    uVar2 = vec<int>::size(local_10);
    if (uVar2 <= uVar1) break;
    piVar4 = vec<int>::operator[](local_10,local_4c);
    if (-1 < *piVar4) {
      in_stack_ffffffffffffff58 = (Propagator *)vec<IntVar_*>::operator[](local_18,local_4c);
      in_stack_ffffffffffffff50 = (IntVar *)in_stack_ffffffffffffff58->_vptr_Propagator;
      piVar4 = vec<int>::operator[](local_10,local_4c);
      IntView<0>::IntView(&local_60,in_stack_ffffffffffffff50,*piVar4,0);
      vec<IntView<0>_>::push
                ((vec<IntView<0>_> *)in_stack_ffffffffffffff50,
                 (IntView<0> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    local_4c = local_4c + 1;
  }
  uVar2 = vec<IntView<0>_>::size(local_48);
  *(uint *)((long)in_RDI + 0x14) = uVar2;
  local_64 = 0;
  while( true ) {
    uVar2 = local_64;
    uVar3 = vec<int>::size(local_10);
    if (uVar3 <= uVar2) break;
    piVar4 = vec<int>::operator[](local_10,local_64);
    if (*piVar4 < 0) {
      in_stack_ffffffffffffff40 = (Propagator *)vec<IntVar_*>::operator[](local_18,local_64);
      v = (IntVar *)in_stack_ffffffffffffff40->_vptr_Propagator;
      piVar4 = vec<int>::operator[](local_10,local_64);
      IntView<0>::IntView(&local_78,v,-*piVar4,0);
      vec<IntView<0>_>::push
                ((vec<IntView<0>_> *)in_stack_ffffffffffffff50,
                 (IntView<0> *)CONCAT44(uVar2,in_stack_ffffffffffffff48));
    }
    local_64 = local_64 + 1;
  }
  pIVar5 = ::vec::operator_cast_to_IntView_((vec *)local_48);
  in_RDI[4] = pIVar5;
  pIVar5 = ::vec::operator_cast_to_IntView_((vec *)local_48);
  in_RDI[5] = pIVar5;
  vec<IntView<0>_>::release(local_48);
  for (local_7c = 0; local_7c < *(int *)(in_RDI + 3); local_7c = local_7c + 1) {
    IntView<0>::attach((IntView<0> *)CONCAT44(uVar1,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                       (int)in_stack_ffffffffffffff50);
  }
  BoolView::attach((BoolView *)in_stack_ffffffffffffff50,
                   (Propagator *)CONCAT44(uVar2,in_stack_ffffffffffffff48),
                   (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40);
  vec<IntView<0>_>::~vec((vec<IntView<0>_> *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

LinearNE(vec<int>& a, vec<IntVar*>& _x, int _c, BoolView _r = bv_true)
			: sz(_x.size()), c(_c), r(std::move(_r)), num_unfixed(sz), sum_fixed(-c) {
		vec<IntView<0> > w;
		for (unsigned int i = 0; i < a.size(); i++) {
			if (a[i] >= 0) {
				w.push(IntView<0>(_x[i], a[i]));
			}
		}
		sp = w.size();
		for (unsigned int i = 0; i < a.size(); i++) {
			if (a[i] < 0) {
				w.push(IntView<0>(_x[i], -a[i]));
			}
		}
		x = (IntView<U>*)(IntView<0>*)w;
		y = (IntView<V>*)(IntView<0>*)w;
		w.release();

		for (int i = 0; i < sz; i++) {
			x[i].attach(this, i, EVENT_F);
		}
		if (R != 0) {
			r.attach(this, sz, EVENT_L);
		}
		//		printf("LinearNE: %d %d %d %d %d\n", sp, sz, U, V, R);
	}